

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O1

bool __thiscall moira::Moira::isValidExt(Moira *this,Instr I,Mode M,u16 op,u32 ext)

{
  uint uVar1;
  
  uVar1 = I - BFCHG;
  if ((uVar1 < 0x17) && ((0x501effU >> (uVar1 & 0x1f) & 1) != 0)) {
    return (*(uint *)(&DAT_00472ad0 + (ulong)uVar1 * 4) & ext) == 0;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/Moira.cpp"
                ,0x318,"bool moira::Moira::isValidExt(Instr, Mode, u16, u32) const");
}

Assistant:

bool
Moira::isValidExt(Instr I, Mode M, u16 op, u32 ext) const
{
    switch (I) {

        case Instr::BFCHG:     return (ext & 0xF000) == 0;
        case Instr::BFCLR:     return (ext & 0xF000) == 0;
        case Instr::BFEXTS:    return (ext & 0x8000) == 0;
        case Instr::BFEXTU:    return (ext & 0x8000) == 0;
        case Instr::BFFFO:     return (ext & 0x8000) == 0;
        case Instr::BFINS:     return (ext & 0x8000) == 0;
        case Instr::BFSET:     return (ext & 0xF000) == 0;
        case Instr::BFTST:     return (ext & 0xF000) == 0;
        case Instr::CAS:       return (ext & 0xFE38) == 0;
        case Instr::CAS2:      return (ext & 0x0E380E38) == 0;
        case Instr::CHK2:      return (ext & 0x07FF) == 0;
        case Instr::CMP2:      return (ext & 0x0FFF) == 0;
        case Instr::MULL:      return (ext & 0x83F8) == 0;
        case Instr::DIVL:      return (ext & 0x83F8) == 0;

        default:
            fatalError;
    }
}